

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

string * __thiscall UniformData::print_abi_cxx11_(string *__return_storage_ptr__,UniformData *this)

{
  ulong uVar1;
  UniformValue *_value;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  _value = &this->value;
  for (uVar1 = 0; uVar1 < this->size; uVar1 = uVar1 + 1) {
    vera::toString<float>(&local_50,_value->_M_elems);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar1 < this->size - 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    _value = (UniformValue *)(_value->_M_elems + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UniformData::print() {
    std::string rta = "";
    for (size_t i = 0; i < size; i++) {
        rta += vera::toString(value[i]);
        if (i < size - 1)
            rta += ",";
    }
    return rta;
}